

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall
QPlainTextEditPrivate::verticalScrollbarActionTriggered(QPlainTextEditPrivate *this,int action)

{
  MoveOperation op;
  
  if (action == 3) {
    op = Down;
  }
  else {
    if (action != 4) {
      return;
    }
    op = Up;
  }
  pageUpDown(this,op,MoveAnchor,false);
  return;
}

Assistant:

void QPlainTextEditPrivate::verticalScrollbarActionTriggered(int action) {

    const auto a = static_cast<QAbstractSlider::SliderAction>(action);
    switch (a) {
    case QAbstractSlider::SliderPageStepAdd:
        pageUpDown(QTextCursor::Down, QTextCursor::MoveAnchor, false);
        break;
    case QAbstractSlider::SliderPageStepSub:
        pageUpDown(QTextCursor::Up, QTextCursor::MoveAnchor, false);
        break;
    default:
        break;
    }
}